

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O2

bool wabt::operator==(OpcodeInfo *lhs,OpcodeInfo *rhs)

{
  bool bVar1;
  
  if (((lhs->opcode_).enum_ == (rhs->opcode_).enum_) && (lhs->kind_ == rhs->kind_)) {
    bVar1 = std::operator==(&lhs->data_,&rhs->data_);
    return bVar1;
  }
  return false;
}

Assistant:

operator Enum() const { return enum_; }